

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddTable.c
# Opt level: O0

void ddRehashZdd(DdManager *unique,int i)

{
  uint uVar1;
  DdNode **__ptr;
  DdNode *pDVar2;
  _func_void_long *p_Var3;
  uint uVar4;
  uint uVar5;
  DdNode **ppDVar6;
  DD_OOMFP saveHandler;
  DdNode *next;
  DdNode *node;
  DdNodePtr *oldnodelist;
  DdNodePtr *nodelist;
  uint local_28;
  int pos;
  int j;
  int oldshift;
  int shift;
  uint oldslots;
  uint slots;
  int i_local;
  DdManager *unique_local;
  
  if (unique->looseUpTo < unique->slots) {
    unique->minDead = unique->slots;
    unique->gcFrac = 1.0;
  }
  p_Var3 = Extra_UtilMMoutOfMemory;
  if (i == 0x7fffffff) {
    __assert_fail("i != CUDD_MAXINDEX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/cudd/cuddTable.c"
                  ,0x98e,"void ddRehashZdd(DdManager *, int)");
  }
  uVar1 = unique->subtableZ[i].slots;
  j = unique->subtableZ[i].shift;
  __ptr = unique->subtableZ[i].nodelist;
  uVar4 = uVar1;
  do {
    shift = uVar4;
    uVar4 = shift * 2;
    j = j + -1;
  } while ((uint)(shift << 3) < unique->subtableZ[i].keys);
  Extra_UtilMMoutOfMemory = Cudd_OutOfMem;
  ppDVar6 = (DdNode **)malloc((ulong)uVar4 << 3);
  Extra_UtilMMoutOfMemory = p_Var3;
  if (ppDVar6 == (DdNode **)0x0) {
    fprintf((FILE *)unique->err,"Unable to resize ZDD subtable %d for lack of memory.\n",
            (ulong)(uint)i);
    cuddGarbageCollect(unique,1);
    for (local_28 = 0; (int)local_28 < unique->sizeZ; local_28 = local_28 + 1) {
      unique->subtableZ[(int)local_28].maxKeys = unique->subtableZ[(int)local_28].maxKeys << 1;
    }
  }
  else {
    unique->subtableZ[i].nodelist = ppDVar6;
    unique->subtableZ[i].slots = uVar4;
    unique->subtableZ[i].shift = j;
    unique->subtableZ[i].maxKeys = shift << 3;
    for (local_28 = 0; local_28 < uVar4; local_28 = local_28 + 1) {
      ppDVar6[(int)local_28] = (DdNode *)0x0;
    }
    for (local_28 = 0; local_28 < uVar1; local_28 = local_28 + 1) {
      next = __ptr[(int)local_28];
      while (next != (DdNode *)0x0) {
        pDVar2 = next->next;
        uVar5 = (((uint)(*(long *)(((ulong)(next->type).kids.T & 0xfffffffffffffffe) + 0x20) << 1) |
                 (uint)*(undefined8 *)&next->type & 1) * 0xc00005 +
                ((uint)(*(long *)(((ulong)(next->type).kids.E & 0xfffffffffffffffe) + 0x20) << 1) |
                (uint)*(undefined8 *)((long)&next->type + 8) & 1)) * 0x40f1f9 >> ((byte)j & 0x1f);
        next->next = ppDVar6[(int)uVar5];
        ppDVar6[(int)uVar5] = next;
        next = pDVar2;
      }
    }
    if (__ptr != (DdNode **)0x0) {
      free(__ptr);
    }
    unique->memused = (ulong)(uVar4 - uVar1) * 8 + unique->memused;
    unique->slots = (uVar4 - uVar1) + unique->slots;
    ddFixLimits(unique);
  }
  return;
}

Assistant:

static void
ddRehashZdd(
  DdManager * unique,
  int  i)
{
    unsigned int slots, oldslots;
    int shift, oldshift;
    int j, pos;
    DdNodePtr *nodelist, *oldnodelist;
    DdNode *node, *next;
    extern DD_OOMFP MMoutOfMemory;
    DD_OOMFP saveHandler;

    if (unique->slots > unique->looseUpTo) {
        unique->minDead = (unsigned) (DD_GC_FRAC_LO * (double) unique->slots);
#ifdef DD_VERBOSE
        if (unique->gcFrac == DD_GC_FRAC_HI) {
            (void) fprintf(unique->err,"GC fraction = %.2f\t",
                           DD_GC_FRAC_LO);
            (void) fprintf(unique->err,"minDead = %d\n", unique->minDead);
        }
#endif
        unique->gcFrac = DD_GC_FRAC_LO;
    }

    assert(i != CUDD_MAXINDEX);
    oldslots = unique->subtableZ[i].slots;
    oldshift = unique->subtableZ[i].shift;
    oldnodelist = unique->subtableZ[i].nodelist;

    /* Compute the new size of the subtable. Normally, we just
    ** double.  However, after reordering, a table may be severely
    ** overloaded. Therefore, we iterate. */
    slots = oldslots;
    shift = oldshift;
    do {
        slots <<= 1;
        shift--;
    } while (slots * DD_MAX_SUBTABLE_DENSITY < unique->subtableZ[i].keys);

    saveHandler = MMoutOfMemory;
    MMoutOfMemory = Cudd_OutOfMem;
    nodelist = ABC_ALLOC(DdNodePtr, slots);
    MMoutOfMemory = saveHandler;
    if (nodelist == NULL) {
        (void) fprintf(unique->err,
                       "Unable to resize ZDD subtable %d for lack of memory.\n",
                       i);
        (void) cuddGarbageCollect(unique,1);
        for (j = 0; j < unique->sizeZ; j++) {
            unique->subtableZ[j].maxKeys <<= 1;
        }
        return;
    }
    unique->subtableZ[i].nodelist = nodelist;
    unique->subtableZ[i].slots = slots;
    unique->subtableZ[i].shift = shift;
    unique->subtableZ[i].maxKeys = slots * DD_MAX_SUBTABLE_DENSITY;
    for (j = 0; (unsigned) j < slots; j++) {
        nodelist[j] = NULL;
    }
    for (j = 0; (unsigned) j < oldslots; j++) {
        node = oldnodelist[j];
        while (node != NULL) {
            next = node->next;
            pos = ddHash(cuddF2L(cuddT(node)), cuddF2L(cuddE(node)), shift);
            node->next = nodelist[pos];
            nodelist[pos] = node;
            node = next;
        }
    }
    ABC_FREE(oldnodelist);

#ifdef DD_VERBOSE
    (void) fprintf(unique->err,
                   "rehashing layer %d: keys %d dead %d new size %d\n",
                   i, unique->subtableZ[i].keys,
                   unique->subtableZ[i].dead, slots);
#endif

    /* Update global data. */
    unique->memused += (slots - oldslots) * sizeof(DdNode *);
    unique->slots += (slots - oldslots);
    ddFixLimits(unique);

}